

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  st_ptls_ech_t *ech;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  _func_void_void_ptr_size_t *p_Var6;
  size_t *psVar7;
  size_t sVar8;
  ptls_hash_algorithm_t *algo;
  ptls_hpke_kem_t *ppVar9;
  ptls_hpke_cipher_suite_t *ppVar10;
  ptls_buffer_t *sendbuf;
  st_ptls_aead_context_t *psVar11;
  ptls_iovec_t info;
  ptls_iovec_t hash_value;
  ptls_iovec_t psk_secret;
  ptls_iovec_t psk_secret_00;
  ptls_iovec_t psk_secret_01;
  ptls_iovec_t psk_identity;
  ptls_iovec_t psk_identity_00;
  ptls_iovec_t psk_identity_01;
  bool bVar12;
  undefined8 uVar13;
  int iVar14;
  ptls_early_data_acceptance_t pVar15;
  uint8_t *src;
  ptls_key_schedule_t *ppVar16;
  ptls_hpke_cipher_suite_t **pppVar17;
  ptls_aead_context_t *ppVar18;
  size_t sVar19;
  char *pcVar20;
  ptls_iovec_t *ppVar21;
  ptls_hpke_kem_t **pppVar22;
  ptls_key_exchange_algorithm_t **pppVar23;
  ptls_cipher_suite_t **pppVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  size_t sVar28;
  ptls_cipher_suite_t *ppVar29;
  ptls_key_exchange_algorithm_t *ppVar30;
  undefined4 uVar31;
  undefined8 in_R8;
  int iVar32;
  size_t sVar33;
  size_t sVar34;
  ptls_handshake_properties_t *properties_00;
  ptls_handshake_properties_t *ppVar35;
  ptls_hash_context_t **pppVar36;
  uint8_t *puVar37;
  size_t sVar38;
  uint8_t *puVar39;
  ptls_iovec_t secret;
  ptls_iovec_t config_list;
  ptls_iovec_t ikm;
  uint32_t max_early_data_size;
  uint32_t age_add;
  uint32_t lifetime;
  st_decoded_ech_config_t decoded;
  ptls_buffer_t infobuf;
  uint8_t binder_key [64];
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd6c;
  char *local_268;
  undefined1 local_258 [16];
  size_t sStack_248;
  ulong uStack_240;
  uint8_t *local_230;
  uint local_228;
  undefined4 local_224;
  uint local_220;
  uint32_t local_21c;
  uint8_t *local_218;
  ulong uStack_210;
  ptls_iovec_t pStack_208;
  char *local_1f8;
  size_t local_1e8;
  size_t local_1e0;
  uint8_t *local_1d8;
  ptls_iovec_t *local_1d0;
  uint8_t *local_1c8;
  uint8_t *local_1c0;
  ptls_iovec_t *local_1b8;
  size_t sStack_1b0;
  st_decoded_ech_config_t local_1a8;
  ptls_buffer_t local_158;
  ptls_iovec_t local_138;
  undefined1 local_128 [248];
  
  local_218 = (uint8_t *)0x0;
  uStack_210 = 0;
  pStack_208.base = (uint8_t *)0x0;
  pStack_208.len = 0;
  local_1f8 = (char *)0x0;
  ppVar4 = tls->key_schedule;
  local_258._0_8_ = "";
  register0x00001200 = ZEXT416(0) << 0x40;
  uStack_240 = uStack_240 & 0xffffffffffff0000;
  properties_00 = properties;
  ppVar35 = properties;
  if ((tls->server_name == (char *)0x0) ||
     (iVar14 = ptls_server_name_is_ipaddr(tls->server_name), iVar14 != 0)) {
    uVar31 = (undefined4)CONCAT71((int7)((ulong)in_R8 >> 8),1);
    local_268 = (char *)0x0;
  }
  else {
    local_268 = tls->server_name;
    uVar31 = (undefined4)CONCAT71((int7)((ulong)in_R8 >> 8),local_268 == (char *)0x0);
    if ((properties != (ptls_handshake_properties_t *)0x0 && ppVar4 == (ptls_key_schedule_t *)0x0)
        && local_268 != (char *)0x0) {
      ppVar5 = tls->ctx;
      pppVar17 = (ppVar5->ech).client.ciphers;
      if (pppVar17 == (ptls_hpke_cipher_suite_t **)0x0) {
        uVar31 = 0;
      }
      else {
        sVar33 = (properties->field_0).client.ech.configs.len;
        if (sVar33 == 0) {
          p_Var6 = ppVar5->random_bytes;
          pppVar22 = (ppVar5->ech).client.kems;
          ppVar9 = *pppVar22;
          while (ppVar9 != (ptls_hpke_kem_t *)0x0) {
            pppVar22 = pppVar22 + 1;
            if (ppVar9->id == 0x20) {
              (tls->ech).kem = ppVar9;
              break;
            }
            ppVar9 = *pppVar22;
          }
          ppVar10 = *pppVar17;
          while (ppVar10 != (ptls_hpke_cipher_suite_t *)0x0) {
            pppVar17 = pppVar17 + 1;
            if (((ppVar10->id).kdf == 1) && ((ppVar10->id).aead == 1)) {
              (tls->ech).cipher = ppVar10;
              break;
            }
            ppVar10 = *pppVar17;
          }
          if (((tls->ech).kem != (ptls_hpke_kem_t *)0x0) &&
             ((tls->ech).cipher != (ptls_hpke_cipher_suite_t *)0x0)) {
            (*p_Var6)(&local_138,0x20);
            ppVar18 = ptls_aead_new_direct(((tls->ech).cipher)->aead,1,&local_138,local_128);
            (tls->ech).aead = ppVar18;
            puVar39 = (uint8_t *)malloc(0x20);
            (tls->ech).client.enc.base = puVar39;
            if (puVar39 != (uint8_t *)0x0) {
              (tls->ech).client.enc.len = 0x20;
              (*p_Var6)(puVar39,0x20);
              (*p_Var6)(&(tls->ech).config_id,1);
              (tls->ech).client.max_name_length = '@';
              sVar28 = strlen(local_268);
              pcVar20 = (char *)malloc(sVar28 + 1);
              if (pcVar20 != (char *)0x0) {
                memcpy(pcVar20,local_268,sVar28);
                pcVar20[sVar28] = '\0';
                (tls->ech).client.public_name = pcVar20;
                goto LAB_0010a1ba;
              }
              (tls->ech).client.public_name = (char *)0x0;
            }
          }
          clear_ech(&tls->ech,0);
        }
        else {
          config_list.len = sVar33;
          config_list.base = (properties->field_0).client.ech.configs.base;
          client_decode_ech_config_list(ppVar5,&local_1a8,config_list);
          ppVar9 = local_1a8.kem;
          if (local_1a8.cipher != (ptls_hpke_cipher_suite_t *)0x0 &&
              local_1a8.kem != (ptls_hpke_kem_t *)0x0) {
            p_Var6 = tls->ctx->random_bytes;
            local_158.base = (uint8_t *)&local_138;
            local_158.off = 0;
            local_158.capacity = 0x100;
            local_158.is_allocated = '\0';
            local_158.align_bits = '\0';
            iVar14 = ptls_buffer_reserve_aligned(&local_158,8,'\0');
            if (iVar14 == 0) {
              builtin_memcpy((uint8_t *)((long)(uint8_t **)local_158.base + local_158.off),"tls ech"
                             ,8);
              local_158.off = local_158.off + 8;
              iVar14 = ptls_buffer__do_pushv(&local_158,local_1a8.bytes.base,local_1a8.bytes.len);
              if (iVar14 == 0) {
                local_1b8 = (ptls_iovec_t *)local_158.base;
                sStack_1b0 = local_158.off;
                info.len = local_158.off;
                info.base = local_158.base;
                iVar14 = ptls_hpke_setup_base_s
                                   (ppVar9,local_1a8.cipher,&(tls->ech).client.enc,&(tls->ech).aead,
                                    local_1a8.public_key,info);
                if (iVar14 == 0) {
                  (tls->ech).config_id = local_1a8.id;
                  (tls->ech).kem = ppVar9;
                  (tls->ech).cipher = local_1a8.cipher;
                  (*p_Var6)((tls->ech).inner_client_random,0x20);
                  (tls->ech).client.max_name_length = local_1a8.max_name_length;
                  pcVar20 = (char *)malloc(local_1a8.public_name.len + 1);
                  if (pcVar20 != (char *)0x0) {
                    memcpy(pcVar20,local_1a8.public_name.base,local_1a8.public_name.len);
                    pcVar20[local_1a8.public_name.len] = '\0';
                    (tls->ech).client.public_name = pcVar20;
                    goto LAB_0010a1ba;
                  }
                  (tls->ech).client.public_name = (char *)0x0;
                  iVar14 = 0x201;
                }
              }
            }
            clear_ech(&tls->ech,0);
            goto LAB_00109afa;
          }
        }
LAB_0010a1ba:
        uVar31 = 0;
        ppVar35 = properties_00;
      }
    }
  }
  bVar12 = properties != (ptls_handshake_properties_t *)0x0;
  ppVar5 = tls->ctx;
  iVar32 = 0;
  local_224 = uVar31;
  if ((ppVar5->pre_shared_key).identity.base == (uint8_t *)0x0) {
    puVar39 = (uint8_t *)0x0;
  }
  else {
    if (ppVar4 == (ptls_key_schedule_t *)0x0) {
      bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
      (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
      pppVar24 = ppVar5->cipher_suites;
      ppVar29 = *pppVar24;
      if (ppVar29 != (ptls_cipher_suite_t *)0x0) {
        do {
          pppVar24 = pppVar24 + 1;
          if (ppVar29->hash == (ppVar5->pre_shared_key).hash) {
            tls->cipher_suite = ppVar29;
            break;
          }
          ppVar29 = *pppVar24;
        } while (ppVar29 != (ptls_cipher_suite_t *)0x0);
      }
      if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
        __assert_fail("tls->cipher_suite != NULL && \"no compatible cipher-suite provided that matches psk.hash\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x954,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      if ((bVar12) && ((ppVar35->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
        *(ppVar35->field_0).client.max_early_data_size = 0xffffffffffffffff;
      }
    }
    else if ((tls->cipher_suite == (ptls_cipher_suite_t *)0x0) ||
            (tls->cipher_suite->hash != (ppVar5->pre_shared_key).hash)) {
      __assert_fail("tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                    ,0x95a,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    puVar39 = (ppVar5->pre_shared_key).secret.base;
    uStack_210 = (ppVar5->pre_shared_key).secret.len;
    pStack_208.base = (ppVar5->pre_shared_key).identity.base;
    pStack_208.len = (ppVar5->pre_shared_key).identity.len;
    local_1f8 = "ext binder";
    local_218 = puVar39;
  }
  if (bVar12 && puVar39 == (uint8_t *)0x0) {
    puVar39 = (ppVar35->field_0).client.session_ticket.base;
    if ((puVar39 == (uint8_t *)0x0) ||
       (ppVar5->key_exchanges == (ptls_key_exchange_algorithm_t **)0x0)) {
      puVar39 = (uint8_t *)0x0;
      iVar32 = 0;
    }
    else {
      puVar37 = puVar39 + *(long *)((long)&ppVar35->field_0 + 0x18);
      local_1a8._0_8_ = puVar39;
      iVar14 = ptls_decode64((uint64_t *)&local_158,(uint8_t **)&local_1a8,puVar37);
      ppVar35 = properties_00;
      if ((iVar14 == 0) &&
         (((1 < (long)puVar37 - local_1a8._0_8_ && (1 < ((long)puVar37 - local_1a8._0_8_) + -2)) &&
          (2 < (ulong)((long)puVar37 - (local_1a8._0_8_ + 4)))))) {
        uVar2 = *(ushort *)local_1a8._0_8_;
        uVar3 = *(ushort *)(local_1a8._0_8_ + 2);
        lVar25 = 0;
        uVar27 = 0;
        do {
          uVar27 = (ulong)((uint8_t *)(local_1a8._0_8_ + 4))[lVar25] | uVar27 << 8;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 3);
        src = (uint8_t *)(local_1a8._0_8_ + 7);
        if (uVar27 <= (ulong)((long)puVar37 - (long)src)) {
          puVar39 = src + uVar27;
          iVar14 = decode_new_session_ticket
                             (tls,(uint32_t *)&local_1b8,&local_21c,&local_138,&pStack_208,
                              &local_220,src,puVar39);
          ppVar35 = properties_00;
          if ((1 < (ulong)((long)puVar37 - (long)puVar39)) && (iVar14 == 0)) {
            uStack_210 = (ulong)(ushort)(*(ushort *)puVar39 << 8 | *(ushort *)puVar39 >> 8);
            puVar39 = puVar39 + 2;
            if ((uStack_210 <= (ulong)((long)puVar37 - (long)puVar39)) &&
               (puVar39 + uStack_210 == puVar37)) {
              ppVar5 = tls->ctx;
              pppVar23 = ppVar5->key_exchanges;
              ppVar30 = *pppVar23;
              while (ppVar30 != (ptls_key_exchange_algorithm_t *)0x0) {
                pppVar23 = pppVar23 + 1;
                if (ppVar30->id == (uint16_t)(uVar2 << 8 | uVar2 >> 8)) {
                  pppVar24 = ppVar5->cipher_suites;
                  ppVar29 = *pppVar24;
                  goto joined_r0x0010a1e4;
                }
                ppVar30 = *pppVar23;
              }
            }
          }
        }
      }
LAB_00109608:
      local_218 = (uint8_t *)0x0;
      uStack_210 = 0;
      puVar39 = (uint8_t *)0x0;
      iVar32 = 0;
      properties_00 = ppVar35;
    }
  }
LAB_00109629:
  if (bVar12) {
    pVar15 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) == 0) {
      psVar7 = (ppVar35->field_0).client.max_early_data_size;
      pVar15 = PTLS_EARLY_DATA_REJECTED;
      if (psVar7 != (size_t *)0x0) {
        *psVar7 = 0;
      }
    }
    (ppVar35->field_0).client.early_data_acceptance = pVar15;
  }
  ppVar30 = tls->key_share;
  if (ppVar30 == (ptls_key_exchange_algorithm_t *)0x0) {
    pppVar23 = tls->ctx->key_exchanges;
    if ((pppVar23 == (ptls_key_exchange_algorithm_t **)0x0) ||
       ((bVar12 && (((ppVar35->field_0).server.selected_psk_binder.base[0x2c] & 1) != 0)))) {
      ppVar30 = (st_ptls_key_exchange_algorithm_t *)0x0;
    }
    else {
      ppVar30 = *pppVar23;
      tls->key_share = ppVar30;
    }
  }
  if ((tls->field_19).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    __assert_fail("tls->client.key_share_ctx == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x98a,
                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                 );
  }
  if ((ppVar30 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
     (iVar14 = (*ppVar30->create)(ppVar30,&(tls->field_19).client.key_share_ctx), iVar14 != 0))
  goto LAB_00109afa;
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    ppVar16 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               (uint)((tls->ech).aead != (ptls_aead_context_t *)0x0));
    tls->key_schedule = ppVar16;
    if (ppVar16 != (ptls_key_schedule_t *)0x0) {
      ikm.len = uStack_210;
      ikm.base = puVar39;
      iVar14 = key_schedule_extract(ppVar16,ikm);
      if (iVar14 != 0) goto LAB_00109afa;
      goto LAB_001096bd;
    }
LAB_0010a0b6:
    iVar14 = 0x201;
  }
  else {
LAB_001096bd:
    iVar14 = (*emitter->begin_message)(emitter);
    sVar33 = pStack_208.len;
    puVar39 = local_218;
    if (iVar14 != 0) goto LAB_00109afa;
    sVar8 = emitter->buf->off;
    ech = &tls->ech;
    local_1c0 = (tls->ech).inner_client_random;
    local_1c8 = tls->client_random;
    puVar37 = local_1c0;
    if ((tls->ech).aead == (ptls_aead_context_t *)0x0) {
      puVar37 = local_1c8;
    }
    local_1d8 = pStack_208.base;
    uVar26 = (uint)(ppVar4 != (ptls_key_schedule_t *)0x0);
    psk_secret.len = (size_t)pStack_208.base;
    psk_secret.base = local_218;
    psk_identity.len._0_4_ = iVar32;
    psk_identity.base = (uint8_t *)pStack_208.len;
    psk_identity.len._4_4_ = in_stack_fffffffffffffd54;
    local_1d0 = cookie;
    iVar14 = encode_client_hello(tls->ctx,emitter->buf,ENCODE_CH_MODE_INNER,uVar26,properties_00,
                                 puVar37,(tls->field_19).client.key_share_ctx,local_268,
                                 (tls->field_19).client.legacy_session_id,ech,(size_t *)0x0,
                                 (tls->ech).client.first_ech,psk_secret,psk_identity,
                                 (uint32_t)(tls->key_schedule->hashes[0].algo)->digest_size,
                                 (size_t)cookie,
                                 (ptls_iovec_t *)
                                 (CONCAT44(in_stack_fffffffffffffd6c,
                                           *(uint *)((long)&tls->field_19 + 0x38) >> 1) &
                                 0xffffffff00000001),(int)properties_00);
    if (iVar14 != 0) goto LAB_00109afa;
    local_1e0 = sVar33;
    local_230 = puVar39;
    sVar33 = sVar8;
    local_228 = uVar26;
    if (puVar39 != (uint8_t *)0x0) {
      sVar33 = emitter->buf->off;
      algo = tls->key_schedule->hashes[0].algo;
      ppVar9 = (ptls_hpke_kem_t *)algo->digest_size;
      local_1a8._0_8_ = algo->empty_digest;
      secret.base = tls->key_schedule->secret;
      hash_value.len = (size_t)ppVar9;
      hash_value.base = (uint8_t *)local_1a8._0_8_;
      secret.len = (size_t)ppVar9;
      local_1a8.kem = ppVar9;
      iVar14 = ptls_hkdf_expand_label
                         (algo,&local_138,(size_t)ppVar9,secret,local_1f8,hash_value,(char *)0x0);
      if (iVar14 != 0) goto LAB_00109afa;
      local_1e8 = (sVar33 - (long)ppVar9) - 3;
      ppVar16 = tls->key_schedule;
      puVar39 = emitter->buf->base;
      if (ppVar16->num_hashes != 0) {
        sVar38 = local_1e8 - sVar8;
        pppVar36 = &ppVar16->hashes[0].ctx;
        sVar33 = 0;
        do {
          (*(*pppVar36)->update)(*pppVar36,puVar39 + sVar8,sVar38);
          sVar33 = sVar33 + 1;
          pppVar36 = pppVar36 + 3;
        } while (sVar33 != ppVar16->num_hashes);
        puVar39 = emitter->buf->base;
        ppVar16 = tls->key_schedule;
      }
      iVar14 = calc_verify_data(puVar39 + local_1e8 + 3,ppVar16,&local_138);
      sVar33 = local_1e8;
      if (iVar14 != 0) goto LAB_00109afa;
    }
    ppVar16 = tls->key_schedule;
    if (ppVar16->num_hashes != 0) {
      puVar39 = emitter->buf->base;
      sVar38 = emitter->buf->off;
      pppVar36 = &ppVar16->hashes[0].ctx;
      sVar34 = 0;
      do {
        (*(*pppVar36)->update)(*pppVar36,puVar39 + sVar33,sVar38 - sVar33);
        sVar34 = sVar34 + 1;
        pppVar36 = pppVar36 + 3;
      } while (sVar34 != ppVar16->num_hashes);
    }
    ppVar21 = local_1d0;
    uVar26 = local_228;
    puVar39 = local_230;
    if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
      psk_secret_00.len = (size_t)local_1d8;
      psk_secret_00.base = local_230;
      psk_identity_00.len._0_4_ = iVar32;
      psk_identity_00.base = (uint8_t *)local_1e0;
      psk_identity_00.len._4_4_ = in_stack_fffffffffffffd54;
      iVar14 = encode_client_hello(tls->ctx,(ptls_buffer_t *)local_258,ENCODE_CH_MODE_ENCODED_INNER,
                                   local_228,properties_00,local_1c0,
                                   (tls->field_19).client.key_share_ctx,local_268,
                                   (tls->field_19).client.legacy_session_id,ech,(size_t *)0x0,
                                   (ptls_iovec_t)ZEXT816(0),psk_secret_00,psk_identity_00,
                                   (uint32_t)(tls->key_schedule->hashes[0].algo)->digest_size,
                                   (size_t)local_1d0,
                                   (ptls_iovec_t *)
                                   (CONCAT44(in_stack_fffffffffffffd6c,
                                             *(uint *)((long)&tls->field_19 + 0x38) >> 1) &
                                   0xffffffff00000001),(int)properties_00);
      if (iVar14 != 0) goto LAB_00109afa;
      if (puVar39 != (uint8_t *)0x0) {
        sVar28 = (tls->key_schedule->hashes[0].algo)->digest_size;
        memcpy((uint8_t *)(local_258._0_8_ + (sStack_248 - sVar28)),
               emitter->buf->base + (emitter->buf->off - sVar28),sVar28);
      }
      ppVar35 = properties_00;
      if ((char)local_224 == '\0') {
        sVar19 = strlen(local_268);
        sVar28 = (size_t)(tls->ech).client.max_name_length;
        if (sVar28 < sVar19) {
          sVar28 = sVar19;
        }
      }
      else {
        sVar28 = (ulong)(tls->ech).client.max_name_length + 9;
      }
      sVar28 = (sVar28 + sStack_248 + 0x1b & 0xffffffffffffffe0) - (sStack_248 - 4);
      if (sVar28 != 0) {
        iVar14 = ptls_buffer_reserve_aligned((ptls_buffer_t *)local_258,sVar28,'\0');
        if (iVar14 != 0) goto LAB_00109afa;
        properties_00 = ppVar35;
        memset((uint8_t *)(local_258._0_8_ + sStack_248),0,sVar28);
        sStack_248 = sStack_248 + sVar28;
        ppVar35 = properties_00;
      }
      sendbuf = emitter->buf;
      sendbuf->off = sVar8;
      puVar39 = (uint8_t *)((sStack_248 - 4) + ((tls->ech).aead)->algo->tag_size);
      psk_secret_01.len = (size_t)local_1d8;
      psk_secret_01.base = local_230;
      psk_identity_01.len._0_4_ = iVar32;
      psk_identity_01.base = (uint8_t *)local_1e0;
      psk_identity_01.len._4_4_ = in_stack_fffffffffffffd54;
      local_1a8._0_8_ = puVar39;
      iVar14 = encode_client_hello(tls->ctx,sendbuf,ENCODE_CH_MODE_OUTER,uVar26,properties_00,
                                   local_1c8,(tls->field_19).client.key_share_ctx,
                                   (tls->ech).client.public_name,
                                   (tls->field_19).client.legacy_session_id,ech,(size_t *)&local_1a8
                                   ,(ptls_iovec_t)ZEXT816(0),psk_secret_01,psk_identity_01,
                                   (uint32_t)(tls->key_schedule->hashes[0].algo)->digest_size,
                                   (size_t)ppVar21,
                                   (ptls_iovec_t *)
                                   (CONCAT44(in_stack_fffffffffffffd6c,
                                             *(uint *)((long)&tls->field_19 + 0x38) >> 1) &
                                   0xffffffff00000001),(int)ppVar35);
      uVar13 = local_1a8._0_8_;
      if (iVar14 != 0) goto LAB_00109afa;
      psVar11 = (tls->ech).aead;
      puVar37 = emitter->buf->base;
      (*psVar11->do_encrypt)
                (psVar11,(uint8_t *)(local_1a8._0_8_ + (long)puVar37),
                 (uint8_t *)(local_258._0_8_ + 4),sStack_248 - 4,
                 (ulong)(ppVar4 != (ptls_key_schedule_t *)0x0),puVar37 + sVar8 + 4,
                 (emitter->buf->off - sVar8) - 4,(ptls_aead_supplementary_encryption_t *)0x0);
      if (ppVar4 == (ptls_key_schedule_t *)0x0) {
        sVar33 = (tls->ech).client.enc.len;
        puVar39 = puVar39 + sVar33 + 10;
        puVar37 = (uint8_t *)malloc((size_t)puVar39);
        (tls->ech).client.first_ech.base = puVar37;
        if (puVar37 == (uint8_t *)0x0) goto LAB_0010a0b6;
        memcpy(puVar37,(uint8_t *)(uVar13 + (long)(emitter->buf->base + (-10 - sVar33))),
               (size_t)puVar39);
        (tls->ech).client.first_ech.len = (size_t)puVar39;
        *(byte *)&tls->ech =
             *(byte *)&tls->ech | ((ppVar35->field_0).client.ech.configs.len == 0) + 1U;
      }
      ppVar16 = tls->key_schedule;
      if (ppVar16->num_hashes != 0) {
        puVar39 = emitter->buf->base;
        sVar33 = emitter->buf->off;
        pppVar36 = &ppVar16->hashes[0].ctx_outer;
        sVar38 = 0;
        do {
          (*(*pppVar36)->update)(*pppVar36,puVar39 + sVar8,sVar33 - sVar8);
          sVar38 = sVar38 + 1;
          pppVar36 = pppVar36 + 3;
        } while (sVar38 != ppVar16->num_hashes);
      }
    }
    iVar14 = (*emitter->commit_message)(emitter);
    ppVar21 = local_1d0;
    puVar39 = local_230;
    if (iVar14 == 0) {
      if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) != 0) {
        if (ppVar4 != (ptls_key_schedule_t *)0x0) {
          __assert_fail("!is_second_flight",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x9fb,
                        "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                       );
        }
        iVar14 = setup_traffic_protection(tls,1,"c e traffic",1,0,0);
        if ((iVar14 != 0) || (iVar14 = push_change_cipher_spec(tls,emitter), iVar14 != 0))
        goto LAB_00109afa;
      }
      if ((ppVar4 != (ptls_key_schedule_t *)0x0 || puVar39 == (uint8_t *)0x0) ||
         (iVar14 = derive_exporter_secret(tls,1), iVar14 == 0)) {
        tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (ppVar21 == (ptls_iovec_t *)0x0)
        ;
        iVar14 = 0x202;
      }
    }
  }
LAB_00109afa:
  (*ptls_clear_memory)((void *)local_258._0_8_,sStack_248);
  if ((uint8_t)uStack_240 != '\0') {
    free((void *)local_258._0_8_);
  }
  local_258._0_8_ = (uint8_t *)0x0;
  stack0xfffffffffffffdb0 = ZEXT816(0);
  uStack_240._0_1_ = '\0';
  uStack_240._1_1_ = '\0';
  uStack_240._2_6_ = 0;
  (*ptls_clear_memory)(&local_138,0x40);
  return iVar14;
joined_r0x0010a1e4:
  if (ppVar29 == (ptls_cipher_suite_t *)0x0) goto LAB_00109608;
  pppVar24 = pppVar24 + 1;
  if (ppVar29->id == (uint16_t)(uVar3 << 8 | uVar3 >> 8)) {
    local_218 = puVar39;
    ppVar21 = (ptls_iovec_t *)(*ppVar5->get_time->cb)(ppVar5->get_time);
    if ((local_158.base <= ppVar21) && ((ulong)((long)ppVar21 - (long)local_158.base) < 0x240c8400))
    {
      local_1f8 = "res binder";
      bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
      iVar32 = (int)((long)ppVar21 - (long)local_158.base) + local_21c;
      (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = ppVar30;
      }
      tls->cipher_suite = ppVar29;
      properties_00 = ppVar35;
      if ((local_220 != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
         ((ppVar35->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
        *(ppVar35->field_0).client.max_early_data_size = (ulong)local_220;
      }
      goto LAB_00109629;
    }
    goto LAB_00109608;
  }
  ppVar29 = *pppVar24;
  goto joined_r0x0010a1e4;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    struct {
        ptls_iovec_t secret;
        ptls_iovec_t identity;
        const char *label;
    } psk = {{NULL}};
    uint32_t obfuscated_ticket_age = 0;
    const char *sni_name = NULL;
    size_t mess_start, msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    ptls_buffer_t encoded_ch_inner;
    int ret, is_second_flight = tls->key_schedule != NULL;

    ptls_buffer_init(&encoded_ch_inner, "", 0);

    if (tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))
        sni_name = tls->server_name;

    /* try to use ECH (ignore broken ECHConfigList; it is delivered insecurely) */
    if (properties != NULL) {
        if (!is_second_flight && sni_name != NULL && tls->ctx->ech.client.ciphers != NULL) {
            if (properties->client.ech.configs.len != 0) {
                struct st_decoded_ech_config_t decoded;
                client_decode_ech_config_list(tls->ctx, &decoded, properties->client.ech.configs);
                if (decoded.kem != NULL && decoded.cipher != NULL) {
                    if ((ret = client_setup_ech(&tls->ech, &decoded, tls->ctx->random_bytes)) != 0)
                        goto Exit;
                }
            } else {
                /* zero-length config indicates ECH greasing */
                client_setup_ech_grease(&tls->ech, tls->ctx->random_bytes, tls->ctx->ech.client.kems, tls->ctx->ech.client.ciphers,
                                        sni_name);
            }
        }
    }

    /* use external PSK if provided */
    if (tls->ctx->pre_shared_key.identity.base != NULL) {
        if (!is_second_flight) {
            tls->client.offered_psk = 1;
            for (size_t i = 0; tls->ctx->cipher_suites[i] != NULL; ++i) {
                if (tls->ctx->cipher_suites[i]->hash == tls->ctx->pre_shared_key.hash) {
                    tls->cipher_suite = tls->ctx->cipher_suites[i];
                    break;
                }
            }
            assert(tls->cipher_suite != NULL && "no compatible cipher-suite provided that matches psk.hash");
            if (properties != NULL && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = SIZE_MAX;
            }
        } else {
            assert(tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash);
        }
        psk.secret = tls->ctx->pre_shared_key.secret;
        psk.identity = tls->ctx->pre_shared_key.identity;
        psk.label = "ext binder";
    }

    /* try to setup resumption-related data, unless external PSK is used */
    if (psk.secret.base == NULL && properties != NULL && properties->client.session_ticket.base != NULL &&
        tls->ctx->key_exchanges != NULL) {
        ptls_key_exchange_algorithm_t *key_share = NULL;
        ptls_cipher_suite_t *cipher_suite = NULL;
        uint32_t max_early_data_size;
        if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &psk.secret, &obfuscated_ticket_age, &psk.identity,
                                         &max_early_data_size, properties->client.session_ticket.base,
                                         properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
            psk.label = "res binder";
            tls->client.offered_psk = 1;
            /* key-share selected by HRR should not be overridden */
            if (tls->key_share == NULL)
                tls->key_share = key_share;
            tls->cipher_suite = cipher_suite;
            if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = max_early_data_size;
            }
        } else {
            psk.secret = ptls_iovec_init(NULL, 0);
        }
    }

    /* send 0-RTT related signals back to the client */
    if (properties != NULL) {
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && tls->ctx->key_exchanges != NULL &&
        !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    /* instantiate key share context */
    assert(tls->client.key_share_ctx == NULL);
    if (tls->key_share != NULL) {
        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
            goto Exit;
    }

    /* initialize key schedule */
    if (!is_second_flight) {
        if ((tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ech.aead != NULL)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = key_schedule_extract(tls->key_schedule, psk.secret)) != 0)
            goto Exit;
    }

    /* start generating CH */
    if ((ret = emitter->begin_message(emitter)) != 0)
        goto Exit;
    mess_start = msghash_off = emitter->buf->off;

    /* generate true (inner) CH */
    if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_INNER, is_second_flight, properties,
                                   tls->ech.aead != NULL ? tls->ech.inner_client_random : tls->client_random,
                                   tls->client.key_share_ctx, sni_name, tls->client.legacy_session_id, &tls->ech, NULL,
                                   tls->ech.client.first_ech, psk.secret, psk.identity, obfuscated_ticket_age,
                                   tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
        goto Exit;

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (psk.secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, psk.label)) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off, 0);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off, 0);

    /* ECH */
    if (tls->ech.aead != NULL) {
        /* build EncodedCHInner */
        if ((ret = encode_client_hello(tls->ctx, &encoded_ch_inner, ENCODE_CH_MODE_ENCODED_INNER, is_second_flight, properties,
                                       tls->ech.inner_client_random, tls->client.key_share_ctx, sni_name,
                                       tls->client.legacy_session_id, &tls->ech, NULL, ptls_iovec_init(NULL, 0), psk.secret,
                                       psk.identity, obfuscated_ticket_age, tls->key_schedule->hashes[0].algo->digest_size, cookie,
                                       tls->client.using_early_data)) != 0)
            goto Exit;
        if (psk.secret.base != NULL)
            memcpy(encoded_ch_inner.base + encoded_ch_inner.off - tls->key_schedule->hashes[0].algo->digest_size,
                   emitter->buf->base + emitter->buf->off - tls->key_schedule->hashes[0].algo->digest_size,
                   tls->key_schedule->hashes[0].algo->digest_size);
        { /* pad EncodedCHInner (following draft-ietf-tls-esni-15 6.1.3) */
            size_t padding_len;
            if (sni_name != NULL) {
                padding_len = strlen(sni_name);
                if (padding_len < tls->ech.client.max_name_length)
                    padding_len = tls->ech.client.max_name_length;
            } else {
                padding_len = tls->ech.client.max_name_length + 9;
            }
            size_t final_len = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + padding_len;
            final_len = (final_len + 31) / 32 * 32;
            padding_len = final_len - (encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE);
            if (padding_len != 0) {
                if ((ret = ptls_buffer_reserve(&encoded_ch_inner, padding_len)) != 0)
                    goto Exit;
                memset(encoded_ch_inner.base + encoded_ch_inner.off, 0, padding_len);
                encoded_ch_inner.off += padding_len;
            }
        }
        /* flush CHInner, build CHOuterAAD */
        emitter->buf->off = mess_start;
        size_t ech_payload_size = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + tls->ech.aead->algo->tag_size,
               ech_size_offset = ech_payload_size;
        if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_OUTER, is_second_flight, properties,
                                       tls->client_random, tls->client.key_share_ctx, tls->ech.client.public_name,
                                       tls->client.legacy_session_id, &tls->ech, &ech_size_offset, ptls_iovec_init(NULL, 0),
                                       psk.secret, psk.identity, obfuscated_ticket_age,
                                       tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
            goto Exit;
        /* overwrite ECH payload */
        ptls_aead_encrypt(tls->ech.aead, emitter->buf->base + ech_size_offset, encoded_ch_inner.base + PTLS_HANDSHAKE_HEADER_SIZE,
                          encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE, is_second_flight,
                          emitter->buf->base + mess_start + PTLS_HANDSHAKE_HEADER_SIZE,
                          emitter->buf->off - (mess_start + PTLS_HANDSHAKE_HEADER_SIZE));
        /* keep the copy of the 1st ECH extension so that we can send it again in 2nd CH in response to rejection with HRR */
        if (!is_second_flight) {
            size_t len = outer_ech_header_size(tls->ech.client.enc.len) + ech_payload_size;
            if ((tls->ech.client.first_ech.base = malloc(len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(tls->ech.client.first_ech.base,
                   emitter->buf->base + ech_size_offset - outer_ech_header_size(tls->ech.client.enc.len), len);
            tls->ech.client.first_ech.len = len;
            if (properties->client.ech.configs.len != 0) {
                tls->ech.offered = 1;
            } else {
                tls->ech.offered_grease = 1;
            }
        }
        /* update hash */
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + mess_start, emitter->buf->off - mess_start, 1);
    }

    /* commit CH to the record layer */
    if ((ret = emitter->commit_message(emitter)) != 0)
        goto Exit;

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (psk.secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_buffer_dispose(&encoded_ch_inner);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}